

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,basic_string_view<char,_std::char_traits<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4)

{
  string_view data;
  string_view format_00;
  Arg *in_stack_fffffffffffffed8;
  string local_120;
  Arg local_100;
  Arg local_d0;
  Arg local_a0;
  Arg local_70;
  size_t local_40;
  char *pcStack_38;
  
  format_00._M_len = format._M_str;
  local_40 = arg->_M_len;
  pcStack_38 = arg->_M_str;
  local_70.piece_._M_str = (arg_1->_M_dataplus)._M_p;
  local_70.piece_._M_len = arg_1->_M_string_length;
  local_a0.piece_._M_str = (arg_2->_M_dataplus)._M_p;
  local_a0.piece_._M_len = arg_2->_M_string_length;
  local_d0.piece_._M_str = (arg_3->_M_dataplus)._M_p;
  local_d0.piece_._M_len = arg_3->_M_string_length;
  local_100.piece_._M_str = (arg_4->_M_dataplus)._M_p;
  local_100.piece_._M_len = arg_4->_M_string_length;
  format_00._M_str = (char *)&local_40;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_120,(lts_20250127 *)format._M_len,format_00,&local_70,&local_a0,&local_d0,
             &local_100,in_stack_fffffffffffffed8);
  data._M_str = local_120._M_dataplus._M_p;
  data._M_len = local_120._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_120);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }